

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t read_part_content(curl_mimepart *part,char *buffer,size_t bufsize,_Bool *hasread)

{
  int iVar1;
  size_t local_38;
  size_t sz;
  _Bool *hasread_local;
  size_t bufsize_local;
  char *buffer_local;
  curl_mimepart *part_local;
  
  local_38 = 0;
  if ((part->lastreadstatus + 1 < 2) || (part->lastreadstatus - 0x10000000 < 2)) {
    return part->lastreadstatus;
  }
  if ((part->datasize == -1) || ((part->state).offset < part->datasize)) {
    if (part->kind == MIMEKIND_FILE) {
      if ((part->fp != (FILE *)0x0) && (iVar1 = feof((FILE *)part->fp), iVar1 != 0))
      goto LAB_00a65d15;
    }
    else if (part->kind == MIMEKIND_MULTIPART) {
      local_38 = mime_subparts_read(buffer,1,bufsize,part->arg,hasread);
      goto LAB_00a65d15;
    }
    if (part->readfunc != (curl_read_callback)0x0) {
      if ((part->flags & 4) == 0) {
        if ((*hasread & 1U) != 0) {
          return 0xfffffffffffffffe;
        }
        *hasread = true;
      }
      local_38 = (*part->readfunc)(buffer,1,bufsize,part->arg);
    }
  }
LAB_00a65d15:
  if (local_38 != 0xfffffffffffffffe) {
    if ((local_38 + 1 < 2) || (local_38 - 0x10000000 < 2)) {
      part->lastreadstatus = local_38;
    }
    else {
      (part->state).offset = local_38 + (part->state).offset;
      part->lastreadstatus = local_38;
    }
  }
  return local_38;
}

Assistant:

static size_t read_part_content(curl_mimepart *part,
                                char *buffer, size_t bufsize, bool *hasread)
{
  size_t sz = 0;

  switch(part->lastreadstatus) {
  case 0:
  case CURL_READFUNC_ABORT:
  case CURL_READFUNC_PAUSE:
  case READ_ERROR:
    return part->lastreadstatus;
  default:
    break;
  }

  /* If we can determine we are at end of part data, spare a read. */
  if(part->datasize != (curl_off_t) -1 &&
     part->state.offset >= part->datasize) {
    /* sz is already zero. */
  }
  else {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      /*
       * Cannot be processed as other kinds since read function requires
       * an additional parameter and is highly recursive.
       */
       sz = mime_subparts_read(buffer, 1, bufsize, part->arg, hasread);
       break;
    case MIMEKIND_FILE:
      if(part->fp && feof(part->fp))
        break;  /* At EOF. */
      FALLTHROUGH();
    default:
      if(part->readfunc) {
        if(!(part->flags & MIME_FAST_READ)) {
          if(*hasread)
            return STOP_FILLING;
          *hasread = TRUE;
        }
        sz = part->readfunc(buffer, 1, bufsize, part->arg);
      }
      break;
    }
  }

  switch(sz) {
  case STOP_FILLING:
    break;
  case 0:
  case CURL_READFUNC_ABORT:
  case CURL_READFUNC_PAUSE:
  case READ_ERROR:
    part->lastreadstatus = sz;
    break;
  default:
    part->state.offset += sz;
    part->lastreadstatus = sz;
    break;
  }

  return sz;
}